

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_row_distribution(Integer s_a,Integer iproc,Integer *lo,Integer *hi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Integer IVar4;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  Integer idim;
  Integer nproc;
  Integer hdl;
  
  lVar3 = in_RDI + 1000;
  *in_RDX = SPA[lVar3].ilo;
  IVar4 = pnga_pgroup_nodeid(SPA[lVar3].grp);
  if (in_RSI == IVar4) {
    *in_RDX = SPA[lVar3].ilo;
    *in_RCX = SPA[lVar3].ihi;
  }
  else {
    lVar1 = SPA[lVar3].nprocs;
    lVar2 = SPA[lVar3].idim;
    *in_RDX = (SPA[lVar3].idim * in_RSI) / lVar1;
    while ((*in_RDX * lVar1) / lVar2 < in_RSI) {
      *in_RDX = *in_RDX + 1;
    }
    while (in_RSI < (*in_RDX * lVar1) / lVar2) {
      *in_RDX = *in_RDX + -1;
    }
    if (in_RSI < lVar1 + -1) {
      *in_RCX = (lVar2 * (in_RSI + 1)) / lVar1;
      while ((*in_RCX * lVar1) / lVar2 < in_RSI + 1) {
        *in_RCX = *in_RCX + 1;
      }
      while (in_RSI + 1 < (*in_RCX * lVar1) / lVar2) {
        *in_RCX = *in_RCX + -1;
      }
      *in_RCX = *in_RCX + -1;
    }
    else {
      *in_RCX = lVar2 + -1;
    }
  }
  return;
}

Assistant:

void pnga_sprs_array_row_distribution(Integer s_a, Integer iproc, Integer *lo,
    Integer *hi)
{
  Integer hdl = GA_OFFSET + s_a;
  *lo = SPA[hdl].ilo;
  if (iproc == pnga_pgroup_nodeid(SPA[hdl].grp)) {
    *lo = SPA[hdl].ilo;
    *hi = SPA[hdl].ihi;
  } else {
    Integer nproc = SPA[hdl].nprocs;
    Integer idim = SPA[hdl].idim;
    *lo = (SPA[hdl].idim*iproc)/nproc;
    while (((*lo)*nproc)/idim < iproc) {
      (*lo)++;
    }
    while (((*lo)*nproc)/idim > iproc) {
      (*lo)--;
    }
    if (iproc < nproc-1) {
      (*hi) = (idim*(iproc+1))/nproc;
      while (((*hi)*nproc)/idim < iproc+1) {
        (*hi)++;
      }
      while (((*hi)*nproc)/idim > iproc+1) {
        (*hi)--;
      }
      (*hi)--;
    } else {
      *hi = idim-1;
    }
  }
}